

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_ObjectDefineProperties(JSContext *ctx,JSValue obj,JSValue properties)

{
  JSValue obj_00;
  int iVar1;
  int iVar2;
  JSValueUnion p_00;
  ulong uVar3;
  JSPropertyEnum *tab;
  JSRefCountHeader *p;
  JSRefCountHeader *p_1;
  ulong uVar4;
  JSValue v;
  JSValue JVar5;
  JSValue this_obj;
  uint32_t len;
  JSPropertyEnum *atoms;
  uint local_6c;
  JSValueUnion local_68;
  JSPropertyEnum *local_60;
  ulong local_58;
  int64_t local_50;
  JSPropertyEnum *local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  local_38 = obj.tag;
  local_40 = obj.u;
  if ((int)obj.tag == -1) {
    JVar5 = JS_ToObject(ctx,properties);
    local_50 = JVar5.tag;
    p_00 = JVar5.u;
    iVar1 = -1;
    if ((int)JVar5.tag != 6) {
      iVar1 = JS_GetOwnPropertyNamesInternal(ctx,&local_48,&local_6c,(JSObject *)p_00.ptr,0x13);
      if (iVar1 < 0) {
        iVar1 = -1;
        JVar5 = (JSValue)(ZEXT816(3) << 0x40);
        tab = local_48;
      }
      else {
        local_60 = local_48;
        if ((ulong)local_6c == 0) {
          JVar5 = (JSValue)(ZEXT816(3) << 0x40);
          uVar3 = 0;
        }
        else {
          uVar4 = 0;
          JVar5 = (JSValue)(ZEXT816(3) << 0x40);
          iVar1 = -1;
          local_68 = p_00;
          local_58 = (ulong)local_6c;
          do {
            if ((0xfffffff4 < (uint)JVar5.tag) &&
               (iVar2 = *JVar5.u.ptr, *(int *)JVar5.u.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar5);
            }
            JVar5.tag = local_50;
            JVar5.u.ptr = local_68.ptr;
            this_obj.tag = local_50;
            this_obj.u.ptr = local_68.ptr;
            JVar5 = JS_GetPropertyInternal(ctx,JVar5,local_48[uVar4].atom,this_obj,0);
            tab = local_48;
            if (((int)JVar5.tag == 6) ||
               (obj_00.tag = local_38, obj_00.u.float64 = local_40.float64,
               iVar2 = JS_DefinePropertyDesc(ctx,obj_00,local_48[uVar4].atom,JVar5,0x4000),
               tab = local_60, iVar2 < 0)) {
              local_6c = (uint)local_58;
              p_00 = local_68;
              goto LAB_00160563;
            }
            uVar4 = uVar4 + 1;
            uVar3 = local_58;
            p_00 = local_68;
          } while (local_58 != uVar4);
        }
        iVar1 = 0;
        local_6c = (uint)uVar3;
        tab = local_60;
      }
LAB_00160563:
      js_free_prop_enum(ctx,tab,local_6c);
      if ((0xfffffff4 < (uint)local_50) &&
         (iVar2 = *p_00.ptr, *(int *)p_00.ptr = iVar2 + -1, iVar2 < 2)) {
        v.tag = local_50;
        v.u.ptr = p_00.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      if ((0xfffffff4 < (uint)JVar5.tag) &&
         (iVar2 = *JVar5.u.ptr, *(int *)JVar5.u.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar5);
      }
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static __exception int JS_ObjectDefineProperties(JSContext *ctx,
                                                 JSValueConst obj,
                                                 JSValueConst properties)
{
    JSValue props, desc;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i;
    int ret = -1;

    if (!JS_IsObject(obj)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    desc = JS_UNDEFINED;
    props = JS_ToObject(ctx, properties);
    if (JS_IsException(props))
        return -1;
    p = JS_VALUE_GET_OBJ(props);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, JS_GPN_ENUM_ONLY | JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK) < 0)
        goto exception;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, desc);
        desc = JS_GetProperty(ctx, props, atoms[i].atom);
        if (JS_IsException(desc))
            goto exception;
        if (JS_DefinePropertyDesc(ctx, obj, atoms[i].atom, desc, JS_PROP_THROW) < 0)
            goto exception;
    }
    ret = 0;

exception:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, props);
    JS_FreeValue(ctx, desc);
    return ret;
}